

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

double xmlXPathNodeToNumberInternal(xmlXPathParserContextPtr ctxt,xmlNodePtr node)

{
  xmlChar *str;
  double dVar1;
  
  dVar1 = xmlXPathNAN;
  if (node != (xmlNodePtr)0x0) {
    str = xmlNodeGetContent(node);
    if (str == (xmlChar *)0x0) {
      xmlXPathPErrMemory(ctxt);
      dVar1 = xmlXPathNAN;
    }
    else {
      dVar1 = xmlXPathStringEvalNumber(str);
      (*xmlFree)(str);
    }
  }
  return dVar1;
}

Assistant:

static double
xmlXPathNodeToNumberInternal(xmlXPathParserContextPtr ctxt, xmlNodePtr node) {
    xmlChar *strval;
    double ret;

    if (node == NULL)
	return(xmlXPathNAN);
    strval = xmlXPathCastNodeToString(node);
    if (strval == NULL) {
        xmlXPathPErrMemory(ctxt);
	return(xmlXPathNAN);
    }
    ret = xmlXPathCastStringToNumber(strval);
    xmlFree(strval);

    return(ret);
}